

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmsg.c
# Opt level: O3

LispPTR mess_readp(void)

{
  return 0;
}

Assistant:

LispPTR mess_readp(void) {
#ifdef MAIKO_HANDLE_CONSOLE_MESSAGES
  struct stat sbuf;
  int size;
  int rval;

  /* polling pty nd flush os message to log file */
  flush_pty();

  /* * * * * * * * * * * * COMMENTED OUT * * * * * * * * *
      SETJMP(NIL);
      TIMEOUT( rval=stat(logfile, &sbuf) );

      if(rval != 0)
        {
          error("osmessage error: can not find a log file under /tmp");
          return(NIL);
        }
      if( previous_size < (int)(sbuf.st_size) ) return(ATOM_T);
  * * * * * * * * * * * * * */

  if (logChanged) return (ATOM_T);
#endif /* MAIKO_HANDLE_CONSOLE_MESSAGES */
  return (NIL);
}